

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_tailer.cpp
# Opt level: O0

char * __thiscall cornelich::excerpt_tailer::index(excerpt_tailer *this,char *__s,int __c)

{
  sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
  *x;
  header_holder<boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int,_int>,_&std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  hVar1;
  bool bVar2;
  int32_t how_much;
  type tVar3;
  type_conflict1 tVar4;
  undefined7 extraout_var;
  uint8_t *puVar5;
  undefined7 extraout_var_00;
  logic_error *this_00;
  streamer *psVar6;
  element_type *peVar7;
  streamer local_270;
  undefined1 local_e8 [40];
  int32_t len2;
  int32_t len;
  uint local_b0;
  int local_ac;
  int32_t data_offset;
  int32_t data_file_number;
  int64_t data_offset0;
  header_holder<boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int,_int>,_&std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  hStack_98;
  int32_t thread_id;
  int64_t index_value;
  byte local_79;
  ulong uStack_78;
  bool index_file_change;
  int64_t index_offset;
  int32_t index_file_number;
  int32_t cycle_for_index;
  int64_t index_local;
  excerpt_tailer *this_local;
  sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
  *local_50;
  sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
  *local_48;
  int64_t val;
  int64_t *ptr;
  element_type *local_30;
  uint local_28;
  uint local_24;
  uint *puStack_20;
  int32_t val_1;
  int32_t *ptr_1;
  element_type *local_10;
  
  _index_file_number =
       (sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
        *)__s;
  index_local = (int64_t)this;
  tVar4 = util::right_shift<long>((long)__s,this->m_chronicle->m_entries_for_cycle_bits);
  index_offset._4_4_ = (int)tVar4;
  tVar4 = util::right_shift<long>
                    ((ulong)_index_file_number & this->m_chronicle->m_entries_for_cycle_mask,
                     this->m_chronicle->m_index_block_longs_bits);
  index_offset._0_4_ = (int)tVar4;
  uStack_78 = (ulong)_index_file_number & this->m_chronicle->m_index_block_longs_mask;
  local_79 = 0;
  if (((this->m_last_cycle != index_offset._4_4_) ||
      (this->m_last_index_file_number != (int)index_offset)) ||
     (bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_index_region),
     !bVar2)) {
    vanilla_index::index_for
              ((vanilla_index *)&index_value,(int)this->m_chronicle + 0xa0,index_offset._4_4_,
               SUB41((int)index_offset,0));
    std::shared_ptr<cornelich::region>::operator=
              (&this->m_index_region,(shared_ptr<cornelich::region> *)&index_value);
    std::shared_ptr<cornelich::region>::~shared_ptr((shared_ptr<cornelich::region> *)&index_value);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_index_region);
    if (!bVar2) {
      this_local._7_1_ = 0;
      this = (excerpt_tailer *)CONCAT71(extraout_var,bVar2);
      goto LAB_0025019a;
    }
    local_79 = 1;
    this->m_last_cycle = index_offset._4_4_;
    this->m_last_index_file_number = (int)index_offset;
  }
  local_30 = std::__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_index_region);
  ptr._4_4_ = (int)(uStack_78 << 3);
  puVar5 = region::data(local_30);
  val = (int64_t)(puVar5 + ptr._4_4_);
  x = *(sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
        **)val;
  if (x == (sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
            *)0x0) {
    this_local._7_1_ = 0;
    this = (excerpt_tailer *)0x0;
  }
  else {
    hStack_98.member = x;
    local_50 = x;
    local_48 = x;
    how_much = vanilla_chronicle_settings::index_data_offset_bits(&this->m_chronicle->m_settings);
    tVar4 = util::right_shift<long>((long)x,how_much);
    hVar1.member = hStack_98.member;
    data_offset0._4_4_ = (int)tVar4;
    _data_offset = vanilla_chronicle_settings::index_data_offset_mask
                             (&this->m_chronicle->m_settings);
    _data_offset = (ulong)hVar1.member & _data_offset;
    tVar4 = util::right_shift<long>(_data_offset,this->m_chronicle->m_data_block_size_bits);
    local_ac = (int)tVar4;
    local_b0 = (uint)_data_offset & (uint)this->m_chronicle->m_data_block_size_mask;
    if (((this->m_last_thread_id != data_offset0._4_4_) ||
        (this->m_last_data_file_number != local_ac)) || ((local_79 & 1) != 0)) {
      std::__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(this->m_data_region).
                  super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>);
    }
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_data_region);
    if (!bVar2) {
      vanilla_data::data_for
                ((vanilla_data *)&len2,(int)this->m_chronicle + 0x110,index_offset._4_4_,
                 data_offset0._4_4_,SUB41(local_ac,0));
      std::shared_ptr<cornelich::region>::operator=
                (&this->m_data_region,(shared_ptr<cornelich::region> *)&len2);
      std::shared_ptr<cornelich::region>::~shared_ptr((shared_ptr<cornelich::region> *)&len2);
      this->m_last_thread_id = data_offset0._4_4_;
      this->m_last_data_file_number = local_ac;
    }
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_data_region);
    if (bVar2) {
      local_10 = std::
                 __shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_data_region);
      ptr_1._4_4_ = local_b0 - 4;
      if ((ptr_1._4_4_ & 3) != 0) {
        __assert_fail("(offset & 3) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich/region.h"
                      ,0x6d,"std::int32_t cornelich::region::read_ordered32(std::int32_t) const");
      }
      puVar5 = region::data(local_10);
      puStack_20 = (uint *)(puVar5 + (int)ptr_1._4_4_);
      local_e8._36_4_ = *puStack_20;
      if (local_e8._36_4_ == 0) {
        this_local._7_1_ = 0;
        this = (excerpt_tailer *)(ulong)(uint)local_e8._36_4_;
      }
      else {
        local_e8._32_4_ = local_e8._36_4_ ^ 0xffffffff;
        local_28 = local_e8._36_4_;
        local_24 = local_e8._36_4_;
        tVar3 = util::right_shift<int>(local_e8._32_4_,0x1e);
        if (tVar3 != 0) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          util::streamer::streamer(&local_270);
          psVar6 = util::streamer::operator<<(&local_270,(char (*) [20])"Corrupted length 0x");
          psVar6 = util::streamer::operator<<(psVar6,std::hex);
          util::streamer::operator<<(psVar6,(int *)(local_e8 + 0x24));
          util::streamer::operator_cast_to_string((streamer *)local_e8);
          std::logic_error::logic_error(this_00,(string *)local_e8);
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        peVar7 = std::
                 __shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_data_region);
        puVar5 = region::data(peVar7);
        util::buffer_view::reset(&this->m_buffer,puVar5 + (int)local_b0,0,local_e8._32_4_);
        peVar7 = std::
                 __shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_data_region);
        region::data(peVar7);
        this->m_index = (int64_t)_index_file_number;
        this_local._7_1_ = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
      this = (excerpt_tailer *)CONCAT71(extraout_var_00,bVar2);
    }
  }
LAB_0025019a:
  return (char *)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool excerpt_tailer::index(std::int64_t index)
{
    auto cycle_for_index = static_cast<int32_t>(util::right_shift(index, m_chronicle.m_entries_for_cycle_bits));
    auto index_file_number = static_cast<int32_t>(util::right_shift(index & m_chronicle.m_entries_for_cycle_mask, m_chronicle.m_index_block_longs_bits));
    auto index_offset = index & m_chronicle.m_index_block_longs_mask;

    bool index_file_change = false;

    if(m_last_cycle != cycle_for_index || m_last_index_file_number != index_file_number || !m_index_region)
    {
        m_index_region = m_chronicle.m_index.index_for(cycle_for_index, index_file_number, false);
        if(!m_index_region)
            return false;
        index_file_change = true;
        m_last_cycle = cycle_for_index;
        m_last_index_file_number = index_file_number;
    }

    auto index_value = m_index_region->read_ordered64(static_cast<std::int32_t>(index_offset << 3));
    if(!index_value)
        return false;

    auto thread_id = static_cast<std::int32_t>(util::right_shift(index_value, m_chronicle.m_settings.index_data_offset_bits()));
    auto data_offset0 = index_value & m_chronicle.m_settings.index_data_offset_mask();
    auto data_file_number = static_cast<std::int32_t>(util::right_shift(data_offset0, m_chronicle.m_data_block_size_bits));
    auto data_offset = static_cast<std::int32_t>(data_offset0 & m_chronicle.m_data_block_size_mask);

    if(m_last_thread_id != thread_id || m_last_data_file_number != data_file_number || index_file_change)
        m_data_region.reset();

    if (!m_data_region)
    {
        m_data_region = m_chronicle.m_data.data_for(cycle_for_index, thread_id, data_file_number, false);
        m_last_thread_id = thread_id;
        m_last_data_file_number = data_file_number;
    }
    if (!m_data_region)
        return false;

    auto len = m_data_region->read_ordered32(data_offset - 4);
    if(len == 0)
        return false;

    auto len2 = ~len;
    // invalid if either the top two bits are set,
    if(util::right_shift(len2, 30))
        throw std::logic_error(util::streamer() << "Corrupted length 0x" << std::hex << len);

    m_buffer.reset(m_data_region->data() + data_offset, 0, len2);
    __builtin_prefetch(m_data_region->data() + 64, 0);
    m_index = index;

    return true;
}